

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_parse_function_check_names(JSParseState *s,JSFunctionDef *fd,JSAtom func_name)

{
  int iVar1;
  int in_EDX;
  long in_RSI;
  JSParseState *in_RDI;
  int idx;
  int i;
  JSAtom name;
  int local_28;
  int local_24;
  
  if ((*(byte *)(in_RSI + 0x86) & 1) != 0) {
    if ((*(int *)(in_RSI + 0x50) == 0) && (*(int *)(in_RSI + 0x58) != 0)) {
      iVar1 = js_parse_error(in_RDI,
                             "\"use strict\" not allowed in function with default or destructuring parameter"
                            );
      return iVar1;
    }
    if ((in_EDX == 0x3a) || (in_EDX == 0x4d)) {
      iVar1 = js_parse_error(in_RDI,"invalid function name in strict code");
      return iVar1;
    }
    for (local_28 = 0; local_28 < *(int *)(in_RSI + 0xac); local_28 = local_28 + 1) {
      iVar1 = *(int *)(*(long *)(in_RSI + 0xa0) + (long)local_28 * 0x10);
      if ((iVar1 == 0x3a) || (iVar1 == 0x4d)) {
        iVar1 = js_parse_error(in_RDI,"invalid argument name in strict code");
        return iVar1;
      }
    }
  }
  if (((((*(byte *)(in_RSI + 0x86) & 1) != 0) || (*(int *)(in_RSI + 0x50) == 0)) ||
      ((*(ushort *)(in_RSI + 0x84) >> 8 == 6 && ((*(ushort *)(in_RSI + 0x84) & 0xff) == 2)))) ||
     ((*(ushort *)(in_RSI + 0x84) >> 8 == 3 || (*(ushort *)(in_RSI + 0x84) >> 8 == 6)))) {
    for (local_28 = 0; local_28 < *(int *)(in_RSI + 0xac); local_28 = local_28 + 1) {
      iVar1 = *(int *)(*(long *)(in_RSI + 0xa0) + (long)local_28 * 0x10);
      if (iVar1 != 0) {
        for (local_24 = 0; local_24 < local_28; local_24 = local_24 + 1) {
          if (*(int *)(*(long *)(in_RSI + 0xa0) + (long)local_24 * 0x10) == iVar1)
          goto LAB_00193ee4;
        }
        for (local_24 = 0; local_24 < *(int *)(in_RSI + 0x9c); local_24 = local_24 + 1) {
          if ((*(int *)(*(long *)(in_RSI + 0x90) + (long)local_24 * 0x10) == iVar1) &&
             (*(int *)(*(long *)(in_RSI + 0x90) + (long)local_24 * 0x10 + 4) == 0)) {
LAB_00193ee4:
            iVar1 = js_parse_error(in_RDI,"duplicate argument names not allowed in this context");
            return iVar1;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

static int js_parse_function_check_names(JSParseState *s, JSFunctionDef *fd,
                                         JSAtom func_name)
{
    JSAtom name;
    int i, idx;

    if (fd->js_mode & JS_MODE_STRICT) {
        if (!fd->has_simple_parameter_list && fd->has_use_strict) {
            return js_parse_error(s, "\"use strict\" not allowed in function with default or destructuring parameter");
        }
        if (func_name == JS_ATOM_eval || func_name == JS_ATOM_arguments) {
            return js_parse_error(s, "invalid function name in strict code");
        }
        for (idx = 0; idx < fd->arg_count; idx++) {
            name = fd->args[idx].var_name;

            if (name == JS_ATOM_eval || name == JS_ATOM_arguments) {
                return js_parse_error(s, "invalid argument name in strict code");
            }
        }
    }
    /* check async_generator case */
    if ((fd->js_mode & JS_MODE_STRICT)
    ||  !fd->has_simple_parameter_list
    ||  (fd->func_type == JS_PARSE_FUNC_METHOD && fd->func_kind == JS_FUNC_ASYNC)
    ||  fd->func_type == JS_PARSE_FUNC_ARROW
    ||  fd->func_type == JS_PARSE_FUNC_METHOD) {
        for (idx = 0; idx < fd->arg_count; idx++) {
            name = fd->args[idx].var_name;
            if (name != JS_ATOM_NULL) {
                for (i = 0; i < idx; i++) {
                    if (fd->args[i].var_name == name)
                        goto duplicate;
                }
                /* Check if argument name duplicates a destructuring parameter */
                /* XXX: should have a flag for such variables */
                for (i = 0; i < fd->var_count; i++) {
                    if (fd->vars[i].var_name == name &&
                        fd->vars[i].scope_level == 0)
                        goto duplicate;
                }
            }
        }
    }
    return 0;

duplicate:
    return js_parse_error(s, "duplicate argument names not allowed in this context");
}